

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.cpp
# Opt level: O3

int __thiscall
VC1Frame::decode_frame_direct
          (VC1Frame *this,VC1SequenceHeader *sequenceHdr,uint8_t *buffer,uint8_t *end)

{
  uint uVar1;
  
  BitStream::setBuffer((BitStream *)this,buffer,end);
  (this->super_VC1Unit).bitReader.m_bitLeft = 0;
  uVar1 = BitStreamReader::getCurVal
                    ((BitStreamReader *)this,
                     (this->super_VC1Unit).bitReader.super_BitStream.m_buffer);
  (this->super_VC1Unit).bitReader.m_curVal = uVar1;
  (this->super_VC1Unit).bitReader.m_bitLeft = 0x20;
  if ((int)sequenceHdr->profile < 3) {
    vc1_parse_frame_header(this,sequenceHdr);
  }
  else {
    vc1_parse_frame_header_adv(this,sequenceHdr);
  }
  return 0;
}

Assistant:

int VC1Frame::decode_frame_direct(const VC1SequenceHeader& sequenceHdr, uint8_t* buffer, const uint8_t* end)
{
    try
    {
        bitReader.setBuffer(buffer, end);  // skip 00 00 01 xx marker
        if (sequenceHdr.profile < Profile::ADVANCED)
            return vc1_parse_frame_header(sequenceHdr);
        return vc1_parse_frame_header_adv(sequenceHdr);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}